

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCustomAttributes.cpp
# Opt level: O1

void testCustomAttributes(string *tempDir)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _Alloc_hider __filename;
  char *pcVar5;
  char *pcVar6;
  Header *pHVar7;
  TypedAttribute<int> *pTVar8;
  OpaqueAttribute *pOVar9;
  TypedAttribute<Imf_3_4::Glorp> *pTVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar20 [16];
  OutputFile out;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  string filename;
  FrameBuffer fb;
  Header hdr;
  long lVar21;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing custom attributes",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  pcVar5 = (char *)operator_new__(0x29bf4);
  auVar4 = _DAT_001b6b10;
  auVar3 = _DAT_001b6b00;
  pcVar6 = pcVar5 + 4;
  iVar11 = 1;
  iVar12 = 0;
  iVar18 = (int)DAT_001b6b20;
  iVar19 = DAT_001b6b20._4_4_;
  uVar13 = 0;
  do {
    iVar15 = (int)((uVar13 & 0xffffffff) / 0x11);
    iVar14 = iVar11 + iVar15 * -0xaa;
    iVar15 = iVar12 + iVar15 * -0xaa;
    uVar16 = 0;
    lVar17 = 0;
    auVar20 = auVar3;
    do {
      if (SUB164(auVar20 ^ auVar4,4) == iVar19 && SUB164(auVar20 ^ auVar4,0) < iVar18) {
        *(float *)(pcVar6 + lVar17 + -4) = (float)(int)(iVar15 + (uVar16 / 10) * -10);
        *(float *)(pcVar6 + lVar17) = (float)(int)(iVar14 + (uVar16 / 10) * -10);
      }
      lVar21 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar21 + 2;
      lVar17 = lVar17 + 8;
      iVar14 = iVar14 + 2;
      uVar16 = uVar16 + 2;
      iVar15 = iVar15 + 2;
    } while (lVar17 != 0x368);
    uVar13 = uVar13 + 1;
    pcVar6 = pcVar6 + 0x364;
    iVar11 = iVar11 + 10;
    iVar12 = iVar12 + 10;
  } while (uVar13 != 0xc5);
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&filename);
  __filename = filename._M_dataplus;
  Imf_3_4::Attribute::registerAttributeType
            ("glorp",Imf_3_4::TypedAttribute<Imf_3_4::Glorp>::makeNewAttribute);
  _out = (undefined **)0x0;
  Imf_3_4::Header::Header(&hdr,0xd9,0xc5,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  fb._map._M_t._M_impl._0_4_ = 0x19;
  Imf_3_4::TypedAttribute<int>::TypedAttribute((int *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)"custom1");
  Imf_3_4::TypedAttribute<int>::~TypedAttribute((TypedAttribute<int> *)&out);
  Imf_3_4::Attribute::Attribute((Attribute *)&out);
  _out = &PTR__Attribute_001e6098;
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)"custom2");
  Imf_3_4::Attribute::~Attribute((Attribute *)&out);
  pcVar6 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar6,(Channel *)0x1c4132);
  p_Var1 = &fb._map._M_t._M_impl.super__Rb_tree_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,pcVar5,4,0x364,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c4132);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
  std::ostream::flush();
  remove(__filename._M_p);
  iVar11 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile(&out,__filename._M_p,&hdr,iVar11);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
  Imf_3_4::OutputFile::writePixels((int)&out);
  Imf_3_4::OutputFile::~OutputFile(&out);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&fb);
  Imf_3_4::Header::~Header(&hdr);
  Imf_3_4::Attribute::unRegisterAttributeType("glorp");
  _out = (undefined **)0x0;
  Imf_3_4::Header::Header(&hdr,0x40,0x40,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
  std::ostream::flush();
  iVar11 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&out,__filename._M_p,iVar11);
  pHVar7 = (Header *)Imf_3_4::InputFile::header();
  pTVar8 = Imf_3_4::Header::findTypedAttribute<Imf_3_4::TypedAttribute<int>>(pHVar7,"custom1");
  pHVar7 = (Header *)Imf_3_4::InputFile::header();
  pOVar9 = Imf_3_4::Header::findTypedAttribute<Imf_3_4::OpaqueAttribute>(pHVar7,"custom2");
  if ((pTVar8 == (TypedAttribute<int> *)0x0) || (*(int *)(pTVar8 + 8) != 0x19)) {
    __assert_fail("c1 != 0 && c1->value () == 25",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCustomAttributes.cpp"
                  ,0x9f,
                  "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  if (pOVar9 == (OpaqueAttribute *)0x0) {
    __assert_fail("c2 != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCustomAttributes.cpp"
                  ,0xa0,
                  "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pHVar7 = (Header *)Imf_3_4::InputFile::header();
  Imf_3_4::Header::operator=(&hdr,pHVar7);
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x900000004);
  Imf_3_4::Attribute::registerAttributeType
            ("glorp",Imf_3_4::TypedAttribute<Imf_3_4::Glorp>::makeNewAttribute);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,pcVar5,4,0x364,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c4132);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
  std::ostream::flush();
  remove(__filename._M_p);
  iVar11 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile(&out,__filename._M_p,&hdr,iVar11);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
  Imf_3_4::OutputFile::writePixels((int)&out);
  Imf_3_4::OutputFile::~OutputFile(&out);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&fb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
  std::ostream::flush();
  iVar11 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&out,__filename._M_p,iVar11);
  pHVar7 = (Header *)Imf_3_4::InputFile::header();
  pTVar8 = Imf_3_4::Header::findTypedAttribute<Imf_3_4::TypedAttribute<int>>(pHVar7,"custom1");
  pHVar7 = (Header *)Imf_3_4::InputFile::header();
  pTVar10 = Imf_3_4::Header::findTypedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Glorp>>
                      (pHVar7,"custom2");
  if ((pTVar8 != (TypedAttribute<int> *)0x0) && (*(int *)(pTVar8 + 8) == 0x19)) {
    if ((pTVar10 != (TypedAttribute<Imf_3_4::Glorp> *)0x0) &&
       (((pTVar10->_value).a == 4 && ((pTVar10->_value).b == 9)))) {
      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x900000004);
      remove(__filename._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      Imf_3_4::Header::~Header(&hdr);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
      }
      operator_delete__(pcVar5);
      return;
    }
    __assert_fail("c2 != 0 && c2->value ().a == 4 && c2->value ().b == 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCustomAttributes.cpp"
                  ,0xd9,
                  "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  __assert_fail("c1 != 0 && c1->value () == 25",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCustomAttributes.cpp"
                ,0xd8,
                "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
               );
}

Assistant:

void
testCustomAttributes (const std::string& tempDir)
{
    try
    {
        cout << "Testing custom attributes" << endl;

        const int W = 217;
        const int H = 197;

        Array2D<float> pf (H, W);
        fillPixels (pf, W, H);

        std::string filename = tempDir + "imf_test_custom_attr.exr";

        writeReadCustomAttr (pf, filename.c_str (), W, H);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}